

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_endStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  uint uVar1;
  int iVar2;
  size_t code;
  long in_RSI;
  long in_RDI;
  size_t toFlush;
  size_t checksumSize;
  size_t lastBlockSize;
  size_t errcod;
  ZSTD_inBuffer input;
  ZSTD_EndDirective in_stack_00000064;
  ZSTD_inBuffer *in_stack_00000068;
  ZSTD_outBuffer *in_stack_00000070;
  ZSTD_CStream *in_stack_00000078;
  uint local_54;
  undefined1 local_30 [24];
  long local_18;
  long local_10;
  size_t local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_30,0,0x18);
  if (*(ulong *)(local_18 + 8) < *(ulong *)(local_18 + 0x10)) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    code = ZSTD_compressStream_generic
                     (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000064);
    uVar1 = ERR_isError(code);
    local_8 = code;
    if (uVar1 == 0) {
      iVar2 = 3;
      if (*(int *)(local_10 + 0x364) != 0) {
        iVar2 = 0;
      }
      if (*(int *)(local_10 + 0x364) == 0) {
        local_54 = *(int *)(local_10 + 0xac) << 2;
      }
      else {
        local_54 = 0;
      }
      local_8 = (*(long *)(local_10 + 0x350) - *(long *)(local_10 + 0x358)) + (long)iVar2 +
                (ulong)local_54;
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_endStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = { NULL, 0, 0 };
    if (output->pos > output->size) return ERROR(GENERIC);
    CHECK_F( ZSTD_compressStream_generic(zcs, output, &input, ZSTD_e_end) );
    {   size_t const lastBlockSize = zcs->frameEnded ? 0 : ZSTD_BLOCKHEADERSIZE;
        size_t const checksumSize = zcs->frameEnded ? 0 : zcs->appliedParams.fParams.checksumFlag * 4;
        size_t const toFlush = zcs->outBuffContentSize - zcs->outBuffFlushedSize + lastBlockSize + checksumSize;
        DEBUGLOG(4, "ZSTD_endStream : remaining to flush : %u", (U32)toFlush);
        return toFlush;
    }
}